

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall
Inject::ctor_inject::ctor_inject
          (ctor_inject *this,type *service1,type *service2,type *service3,type *service4,
          type *service5,type service6,type service7,type service8,type service9)

{
  int iVar1;
  type psVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined8 local_228;
  undefined **local_220;
  undefined1 local_218;
  undefined8 *local_210;
  char *local_208;
  unique_id local_200;
  type *local_1f8;
  type *local_1f0;
  type *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  this->ctor_num = 9;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = service5;
  local_1f0 = service4;
  local_1e8 = service3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2b7);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_158 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(service1);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_160,0x2b7,1,2,&local_228,"service1->id()",&local_200,
             "id_of<impl1>::id()");
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x2b8);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_168 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(service2);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var_00,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_170,0x2b8,1,2,&local_228,"service2->id()",&local_200,
             "id_of<impl1>::id()");
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x2b9);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_178 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(local_1e8);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var_01,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_180,0x2b9,1,2,&local_228,"service3->id()",&local_200,
             "id_of<impl1>::id()");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2ba);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_188 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(local_1f0);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var_02,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_190,0x2ba,1,2,&local_228,"service4->id()",&local_200,
             "id_of<impl1>::id()");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,699);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_198 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(local_1f8);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var_03,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_1a0,699,1,2,&local_228,"service5->id()",&local_200,
             "id_of<impl1>::id()");
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,700);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_1a8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->
                     ((shared_ptr<Inject::service> *)service6.px);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var_04,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_1b0,700,1,2,&local_228,"service6->id()",&local_200,
             "id_of<impl1>::id()");
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x2bd);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_1b8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->
                     ((shared_ptr<Inject::service> *)service6.pn.pi_);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var_05,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_1c0,0x2bd,1,2,&local_228,"service7->id()",&local_200,
             "id_of<impl1>::id()");
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x2be);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_1c8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->
                     ((shared_ptr<Inject::service> *)service7.px);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var_06,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_1d0,0x2be,1,2,&local_228,"service8->id()",&local_200,
             "id_of<impl1>::id()");
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x2bf);
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_0015fea8;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_1d8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->
                     ((shared_ptr<Inject::service> *)service7.pn.pi_);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_228 = CONCAT44(extraout_var_07,iVar1);
  local_200 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_220,&local_1e0,0x2bf,1,2,&local_228,"service9->id()",&local_200,
             "id_of<impl1>::id()");
  return;
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1,
            context<>::ptr<service>::type service2,
            context<>::ptr<service>::type service3,
            context<>::ptr<service>::type service4,
            context<>::ptr<service>::type service5,
            context<>::ptr<service>::type service6,
            context<>::ptr<service>::type service7,
            context<>::ptr<service>::type service8,
            context<>::ptr<service>::type service9) {
        ctor_num = 9;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service2->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service3->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service4->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service5->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service6->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service7->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service8->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service9->id(), id_of<impl1>::id());
    }